

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O1

void gainstr(obj *otmp,int incr,boolean force)

{
  uint uVar1;
  ulong uVar2;
  
  if (incr == 0) {
    if (u.acurr.a[0] < '\x12') {
      uVar1 = mt_random();
      incr = 1;
      if ((uVar1 & 3) != 0) goto LAB_0014f78b;
      uVar2 = 6;
    }
    else {
      incr = 1;
      uVar2 = 10;
      if ('f' < u.acurr.a[0]) goto LAB_0014f78b;
    }
    uVar1 = mt_random();
    incr = (int)((ulong)uVar1 % uVar2) + 1;
  }
LAB_0014f78b:
  if ((otmp != (obj *)0x0) && ((otmp->field_0x4a & 1) != 0)) {
    incr = -incr;
  }
  adjattrib(0,incr,force,1);
  return;
}

Assistant:

void gainstr(struct obj *otmp, int incr, boolean force)
{
	int num = 1;

	if (incr) num = incr;
	else {
	    if (ABASE(A_STR) < 18) num = (rn2(4) ? 1 : rnd(6) );
	    else if (ABASE(A_STR) < STR18(85)) num = rnd(10);
	}
	adjattrib(A_STR, (otmp && otmp->cursed) ? -num : num, force, 1);
}